

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_nullcheck(void **argtable)

{
  long lVar1;
  int local_24;
  int tabindex;
  arg_hdr **table;
  void **argtable_local;
  
  if (argtable == (void **)0x0) {
    argtable_local._4_4_ = 1;
  }
  else {
    local_24 = 0;
    do {
      if (argtable[local_24] == (void *)0x0) {
        return 1;
      }
      lVar1 = (long)local_24;
      local_24 = local_24 + 1;
    } while ((*argtable[lVar1] & 1) == 0);
    argtable_local._4_4_ = 0;
  }
  return argtable_local._4_4_;
}

Assistant:

int arg_nullcheck(void * *argtable) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int tabindex;
	/*printf("arg_nullcheck(%p)\n",argtable);*/

	if (!table) {
		return 1;
	}

	tabindex = 0;

	do {
		/*printf("argtable[%d]=%p\n",tabindex,argtable[tabindex]);*/
		if (!table[tabindex]) {
			return 1;
		}
	} while (!(table[tabindex++]->flag & ARG_TERMINATOR));

	return 0;
}